

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_encode.cc
# Opt level: O0

void brotli::CreateHuffmanTree(uint32_t *data,size_t length,int tree_limit,uint8_t *depth)

{
  uint32_t uVar1;
  uint32_t uVar2;
  bool bVar3;
  uint uVar4;
  uint *puVar5;
  size_type sVar6;
  reference pvVar7;
  iterator __first;
  size_type sVar8;
  reference pool;
  byte *pbVar9;
  size_t j_end;
  size_t right;
  size_t left;
  size_t k;
  size_t j;
  size_t i;
  HuffmanTree sentinel;
  size_t n;
  uint32_t local_64;
  int16_t iStack_60;
  uint32_t count;
  size_t i_1;
  undefined1 local_48 [8];
  vector<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_> tree;
  uint32_t count_limit;
  uint8_t *depth_local;
  int tree_limit_local;
  size_t length_local;
  uint32_t *data_local;
  
  tree.super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  do {
    std::vector<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>::vector
              ((vector<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_> *)local_48);
    std::vector<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>::reserve
              ((vector<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_> *)local_48,
               length * 2 + 1);
    _iStack_60 = length;
    while (_iStack_60 != 0) {
      _iStack_60 = _iStack_60 - 1;
      if (data[_iStack_60] != 0) {
        puVar5 = std::max<unsigned_int>
                           (data + _iStack_60,
                            (uint *)((long)&tree.
                                            super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 4))
        ;
        local_64 = *puVar5;
        HuffmanTree::HuffmanTree((HuffmanTree *)((long)&n + 4),local_64,-1,iStack_60);
        std::vector<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>::push_back
                  ((vector<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_> *)local_48,
                   (value_type *)((long)&n + 4));
      }
    }
    sVar6 = std::vector<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>::size
                      ((vector<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_> *)local_48
                      );
    if (sVar6 == 1) {
      pvVar7 = std::vector<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>::operator[]
                         ((vector<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_> *)
                          local_48,0);
      depth[pvVar7->index_right_or_value_] = '\x01';
      bVar3 = true;
    }
    else {
      __first = std::vector<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>::begin
                          ((vector<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_> *)
                           local_48);
      sentinel = (HuffmanTree)
                 std::vector<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>::end
                           ((vector<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_> *)
                            local_48);
      std::
      stable_sort<__gnu_cxx::__normal_iterator<brotli::HuffmanTree*,std::vector<brotli::HuffmanTree,std::allocator<brotli::HuffmanTree>>>,bool(*)(brotli::HuffmanTree_const&,brotli::HuffmanTree_const&)>
                ((__normal_iterator<brotli::HuffmanTree_*,_std::vector<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>_>
                  )__first._M_current,
                 (__normal_iterator<brotli::HuffmanTree_*,_std::vector<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>_>
                  )sentinel,SortHuffmanTree);
      uVar4 = std::numeric_limits<unsigned_int>::max();
      HuffmanTree::HuffmanTree((HuffmanTree *)&i,uVar4,-1,-1);
      std::vector<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>::push_back
                ((vector<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_> *)local_48,
                 (value_type *)&i);
      std::vector<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>::push_back
                ((vector<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_> *)local_48,
                 (value_type *)&i);
      j = 0;
      k = sVar6 + 1;
      left = sVar6;
      while (left = left - 1, left != 0) {
        pvVar7 = std::vector<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>::operator[]
                           ((vector<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_> *)
                            local_48,j);
        uVar4 = pvVar7->total_count_;
        pvVar7 = std::vector<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>::operator[]
                           ((vector<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_> *)
                            local_48,k);
        if (pvVar7->total_count_ < uVar4) {
          right = k;
          k = k + 1;
        }
        else {
          right = j;
          j = j + 1;
        }
        pvVar7 = std::vector<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>::operator[]
                           ((vector<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_> *)
                            local_48,j);
        uVar4 = pvVar7->total_count_;
        pvVar7 = std::vector<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>::operator[]
                           ((vector<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_> *)
                            local_48,k);
        if (pvVar7->total_count_ < uVar4) {
          j_end = k;
          k = k + 1;
        }
        else {
          j_end = j;
          j = j + 1;
        }
        sVar8 = std::vector<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>::size
                          ((vector<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_> *)
                           local_48);
        sVar8 = sVar8 - 1;
        pvVar7 = std::vector<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>::operator[]
                           ((vector<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_> *)
                            local_48,right);
        uVar1 = pvVar7->total_count_;
        pvVar7 = std::vector<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>::operator[]
                           ((vector<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_> *)
                            local_48,j_end);
        uVar2 = pvVar7->total_count_;
        pvVar7 = std::vector<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>::operator[]
                           ((vector<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_> *)
                            local_48,sVar8);
        pvVar7->total_count_ = uVar1 + uVar2;
        pvVar7 = std::vector<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>::operator[]
                           ((vector<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_> *)
                            local_48,sVar8);
        pvVar7->index_left_ = (int16_t)right;
        pvVar7 = std::vector<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>::operator[]
                           ((vector<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_> *)
                            local_48,sVar8);
        pvVar7->index_right_or_value_ = (int16_t)j_end;
        std::vector<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>::push_back
                  ((vector<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_> *)local_48,
                   (value_type *)&i);
      }
      sVar8 = std::vector<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>::size
                        ((vector<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_> *)
                         local_48);
      if (sVar8 != sVar6 * 2 + 1) {
        __assert_fail("tree.size() == 2 * n + 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/deps/brotli/enc/entropy_encode.cc"
                      ,0x76,
                      "void brotli::CreateHuffmanTree(const uint32_t *, const size_t, const int, uint8_t *)"
                     );
      }
      pvVar7 = std::vector<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>::operator[]
                         ((vector<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_> *)
                          local_48,sVar6 * 2 - 1);
      pool = std::vector<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>::operator[]
                       ((vector<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_> *)
                        local_48,0);
      SetDepth(pvVar7,pool,depth,'\0');
      pbVar9 = std::max_element<unsigned_char*>(depth,depth + length);
      if (tree_limit < (int)(uint)*pbVar9) {
        bVar3 = false;
      }
      else {
        bVar3 = true;
      }
    }
    std::vector<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>::~vector
              ((vector<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_> *)local_48);
    if (bVar3) {
      return;
    }
    tree.super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ =
         tree.super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_ << 1;
  } while( true );
}

Assistant:

void CreateHuffmanTree(const uint32_t *data,
                       const size_t length,
                       const int tree_limit,
                       uint8_t *depth) {
  // For block sizes below 64 kB, we never need to do a second iteration
  // of this loop. Probably all of our block sizes will be smaller than
  // that, so this loop is mostly of academic interest. If we actually
  // would need this, we would be better off with the Katajainen algorithm.
  for (uint32_t count_limit = 1; ; count_limit *= 2) {
    std::vector<HuffmanTree> tree;
    tree.reserve(2 * length + 1);

    for (size_t i = length; i != 0;) {
      --i;
      if (data[i]) {
        const uint32_t count = std::max(data[i], count_limit);
        tree.push_back(HuffmanTree(count, -1, static_cast<int16_t>(i)));
      }
    }

    const size_t n = tree.size();
    if (n == 1) {
      depth[tree[0].index_right_or_value_] = 1;      // Only one element.
      break;
    }

    std::stable_sort(tree.begin(), tree.end(), SortHuffmanTree);

    // The nodes are:
    // [0, n): the sorted leaf nodes that we start with.
    // [n]: we add a sentinel here.
    // [n + 1, 2n): new parent nodes are added here, starting from
    //              (n+1). These are naturally in ascending order.
    // [2n]: we add a sentinel at the end as well.
    // There will be (2n+1) elements at the end.
    const HuffmanTree sentinel(std::numeric_limits<uint32_t>::max(), -1, -1);
    tree.push_back(sentinel);
    tree.push_back(sentinel);

    size_t i = 0;      // Points to the next leaf node.
    size_t j = n + 1;  // Points to the next non-leaf node.
    for (size_t k = n - 1; k != 0; --k) {
      size_t left, right;
      if (tree[i].total_count_ <= tree[j].total_count_) {
        left = i;
        ++i;
      } else {
        left = j;
        ++j;
      }
      if (tree[i].total_count_ <= tree[j].total_count_) {
        right = i;
        ++i;
      } else {
        right = j;
        ++j;
      }

      // The sentinel node becomes the parent node.
      size_t j_end = tree.size() - 1;
      tree[j_end].total_count_ =
          tree[left].total_count_ + tree[right].total_count_;
      tree[j_end].index_left_ = static_cast<int16_t>(left);
      tree[j_end].index_right_or_value_ = static_cast<int16_t>(right);

      // Add back the last sentinel node.
      tree.push_back(sentinel);
    }
    assert(tree.size() == 2 * n + 1);
    SetDepth(tree[2 * n - 1], &tree[0], depth, 0);

    // We need to pack the Huffman tree in tree_limit bits.
    // If this was not successful, add fake entities to the lowest values
    // and retry.
    if (*std::max_element(&depth[0], &depth[length]) <= tree_limit) {
      break;
    }
  }
}